

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accum.c
# Opt level: O2

int accum_state_fullvar(vector_t ****var,vector_t ***mean,float32 ***dnom,vector_t **feat,
                       uint32 n_feat,uint32 *veclen,uint32 *sseq,uint32 *ci_sseq,uint32 n_frame)

{
  uint uVar1;
  uint uVar2;
  float32 *x;
  float32 **a;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  for (uVar5 = 0; uVar5 != n_frame; uVar5 = uVar5 + 1) {
    uVar2 = 0;
    uVar4 = 0;
    if (ci_sseq != (uint32 *)0x0 && sseq != (uint32 *)0x0) {
      uVar4 = sseq[uVar5];
      uVar2 = ci_sseq[uVar5];
    }
    for (uVar6 = 0; uVar6 != n_feat; uVar6 = uVar6 + 1) {
      x = (float32 *)
          __ckd_calloc__((ulong)veclen[uVar6],4,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/accum.c"
                         ,0xb6);
      a = (float32 **)
          __ckd_calloc_2d__((ulong)veclen[uVar6],(ulong)veclen[uVar6],4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/accum.c"
                            ,0xb7);
      *dnom[uVar4][uVar6] = (float32)((float)*dnom[uVar4][uVar6] + 1.0);
      if (uVar4 != uVar2) {
        *dnom[uVar2][uVar6] = (float32)((float)*dnom[uVar2][uVar6] + 1.0);
      }
      uVar1 = veclen[uVar6];
      for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
        x[uVar3] = (float32)(feat[uVar5][uVar6][uVar3] - (*mean[uVar4][uVar6])[uVar3]);
      }
      outerproduct(a,x,x,uVar1);
      matrixadd((float32 **)*var[uVar4][uVar6],a,veclen[uVar6]);
      if (uVar4 != uVar2) {
        uVar1 = veclen[uVar6];
        for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
          x[uVar3] = (float32)(feat[uVar5][uVar6][uVar3] - (*mean[uVar2][uVar6])[uVar3]);
        }
        outerproduct(a,x,x,uVar1);
        matrixadd((float32 **)*var[uVar2][uVar6],a,veclen[uVar6]);
      }
      ckd_free(x);
      ckd_free_2d(a);
    }
  }
  return 0;
}

Assistant:

int
accum_state_fullvar(vector_t ****var,
		    vector_t ***mean,
		    float32  ***dnom,
		    vector_t **feat,
		    uint32 n_feat,
		    const uint32 *veclen,
		    uint32 *sseq,
		    uint32 *ci_sseq,
		    uint32 n_frame)
{
    uint32 t;		/* time (in frames) */
    uint32 s;		/* a tied state */
    uint32 ci_s;	/* a CI tied state */
    uint32 f;		/* a feature stream idx */
    uint32 c;		/* a vector component idx */

    for (t = 0; t < n_frame; t++) {

	if (sseq && ci_sseq) {
	    /* get the tied state for time t */
	    s = sseq[t];
	
	    /* get the CI state as well */
	    ci_s = ci_sseq[t];
	}
	else {
	    s = 0;
	    ci_s = 0;
	}

	for (f = 0; f < n_feat; f++) {
	    vector_t dvec = ckd_calloc(veclen[f], sizeof(float32));
	    vector_t *cov = (vector_t *)ckd_calloc_2d(veclen[f], veclen[f], sizeof(float32));

	    dnom[s][f][0] += 1.0;
	    if (s != ci_s) {
		dnom[ci_s][f][0] += 1.0;
	    }
	    for (c = 0; c < veclen[f]; c++)
		dvec[c] = feat[t][f][c] - mean[s][f][0][c];

	    outerproduct(cov, dvec, dvec, veclen[f]);
	    matrixadd(var[s][f][0], cov, veclen[f]);

	    if (s != ci_s) {
		for (c = 0; c < veclen[f]; c++)
		    dvec[c] = feat[t][f][c] - mean[ci_s][f][0][c];
		outerproduct(cov, dvec, dvec, veclen[f]);
		matrixadd(var[ci_s][f][0], cov, veclen[f]);
	    }
	    ckd_free(dvec);
	    ckd_free_2d((void **)cov);
	}
    }
    return 0;
}